

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_FlagsValidator_InvalidFlagViaSetDefault::Run(void)

{
  bool bVar1;
  char *pcVar2;
  FlagSettingMode in_R8D;
  char *pcVar3;
  FlagSaver fs;
  string local_38;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","FlagsValidator","InvalidFlagViaSetDefault");
  bVar1 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
  if (bVar1) {
    SetCommandLineOptionWithMode_abi_cxx11_(&local_38,(gflags *)0x14d2f1,"50",(char *)0x1,in_R8D);
    bVar1 = std::operator==("",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      if ((anonymous_namespace)::fLI::FLAGS_test_flag == -1) {
        bVar1 = RegisterFlagValidator
                          (&(anonymous_namespace)::fLI::FLAGS_test_flag,
                           (_func_bool_char_ptr_int32 *)0x0);
        if (bVar1) {
          FlagSaver::~FlagSaver(&fs);
          return;
        }
        pcVar2 = "RegisterFlagValidator(&FLAGS_test_flag, NULL)";
        goto LAB_0013a192;
      }
      pcVar2 = "-1";
      pcVar3 = "FLAGS_test_flag";
    }
    else {
      pcVar2 = "\"\"";
      pcVar3 = "SetCommandLineOptionWithMode(\"test_flag\", \"50\", SET_FLAG_IF_DEFAULT)";
    }
    fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar3);
  }
  else {
    pcVar2 = "RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5)";
LAB_0013a192:
    fprintf(_stderr,"Check failed: %s\n",pcVar2);
  }
  exit(1);
}

Assistant:

TEST(FlagsValidator, InvalidFlagViaSetDefault) {
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  // SetCommandLineOptionWithMode returns the empty string on error.
  EXPECT_EQ("", SetCommandLineOptionWithMode("test_flag", "50",
                                             SET_FLAG_IF_DEFAULT));
  EXPECT_EQ(-1, FLAGS_test_flag);   // the setting-to-50 should have failed
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, NULL));
}